

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O2

int __thiscall zmq::msg_t::init_delimiter(msg_t *this)

{
  (this->_u).base.metadata = (metadata_t *)0x0;
  (this->_u).base.type = 'g';
  *(undefined4 *)((long)&this->_u + 0x2b) = 0;
  *(undefined4 *)((long)&(this->_u).base.routing_id + 2) = 0;
  return 0;
}

Assistant:

int zmq::msg_t::init_delimiter ()
{
    _u.delimiter.metadata = NULL;
    _u.delimiter.type = type_delimiter;
    _u.delimiter.flags = 0;
    _u.delimiter.group.sgroup.group[0] = '\0';
    _u.delimiter.group.type = group_type_short;
    _u.delimiter.routing_id = 0;
    return 0;
}